

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeFabricEdgeGetExp
          (ze_fabric_vertex_handle_t hVertexA,ze_fabric_vertex_handle_t hVertexB,uint32_t *pCount,
          ze_fabric_edge_handle_t *phEdges)

{
  object_t<_ze_fabric_edge_handle_t_*> *poVar1;
  bool bVar2;
  bad_alloc *anon_var_0;
  ulong local_50;
  size_t i;
  ze_pfnFabricEdgeGetExp_t pfnGetExp;
  dditable_t *dditable;
  ze_fabric_edge_handle_t *pp_Stack_30;
  ze_result_t result;
  ze_fabric_edge_handle_t *phEdges_local;
  uint32_t *pCount_local;
  ze_fabric_vertex_handle_t hVertexB_local;
  ze_fabric_vertex_handle_t hVertexA_local;
  
  dditable._4_4_ = 0;
  pfnGetExp = *(ze_pfnFabricEdgeGetExp_t *)(hVertexA + 8);
  if (*(code **)(pfnGetExp + 0x640) == (code *)0x0) {
    hVertexA_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hVertexB_local = *(ze_fabric_vertex_handle_t *)hVertexA;
    pCount_local = *(uint32_t **)hVertexB;
    pp_Stack_30 = phEdges;
    phEdges_local = (ze_fabric_edge_handle_t *)pCount;
    dditable._4_4_ = (**(code **)(pfnGetExp + 0x640))(hVertexB_local,pCount_local,pCount);
    hVertexA_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      local_50 = 0;
      while( true ) {
        bVar2 = false;
        if (pp_Stack_30 != (ze_fabric_edge_handle_t *)0x0) {
          bVar2 = local_50 < *(uint *)phEdges_local;
        }
        if (!bVar2) break;
        poVar1 = singleton_factory_t<object_t<_ze_fabric_edge_handle_t*>,_ze_fabric_edge_handle_t*>
                 ::getInstance<_ze_fabric_edge_handle_t*&,dditable_t*&>
                           ((singleton_factory_t<object_t<_ze_fabric_edge_handle_t*>,_ze_fabric_edge_handle_t*>
                             *)(context + 0x300),pp_Stack_30 + local_50,(dditable_t **)&pfnGetExp);
        pp_Stack_30[local_50] = (ze_fabric_edge_handle_t)poVar1;
        local_50 = local_50 + 1;
      }
      hVertexA_local._4_4_ = dditable._4_4_;
    }
  }
  return hVertexA_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricEdgeGetExp(
        ze_fabric_vertex_handle_t hVertexA,             ///< [in] handle of first fabric vertex instance
        ze_fabric_vertex_handle_t hVertexB,             ///< [in] handle of second fabric vertex instance
        uint32_t* pCount,                               ///< [in,out] pointer to the number of fabric edges.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of fabric edges available.
                                                        ///< if count is greater than the number of fabric edges available, then
                                                        ///< the driver shall update the value with the correct number of fabric
                                                        ///< edges available.
        ze_fabric_edge_handle_t* phEdges                ///< [in,out][optional][range(0, *pCount)] array of handle of fabric edges.
                                                        ///< if count is less than the number of fabric edges available, then
                                                        ///< driver shall only retrieve that number of fabric edges.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_fabric_vertex_object_t*>( hVertexA )->dditable;
        auto pfnGetExp = dditable->ze.FabricEdgeExp.pfnGetExp;
        if( nullptr == pfnGetExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hVertexA = reinterpret_cast<ze_fabric_vertex_object_t*>( hVertexA )->handle;

        // convert loader handle to driver handle
        hVertexB = reinterpret_cast<ze_fabric_vertex_object_t*>( hVertexB )->handle;

        // forward to device-driver
        result = pfnGetExp( hVertexA, hVertexB, pCount, phEdges );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handles to loader handles
            for( size_t i = 0; ( nullptr != phEdges ) && ( i < *pCount ); ++i )
                phEdges[ i ] = reinterpret_cast<ze_fabric_edge_handle_t>(
                    context->ze_fabric_edge_factory.getInstance( phEdges[ i ], dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }